

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O0

void test27(char *infile,char *password,char *outfile,char *xarg)

{
  int iVar1;
  undefined4 uVar2;
  char *pcVar3;
  long lVar4;
  long *plVar5;
  void *pvVar6;
  long lStack_38;
  qpdf_oh p_utf8_string_with_null;
  size_t length;
  char *pcStack_28;
  qpdf_oh p_string_with_null;
  char *xarg_local;
  char *outfile_local;
  char *password_local;
  char *infile_local;
  
  pcStack_28 = xarg;
  xarg_local = outfile;
  outfile_local = password;
  password_local = infile;
  length._4_4_ = qpdf_oh_parse(qpdf,"<6f6e650074776f>");
  iVar1 = qpdf_oh_is_string(qpdf,length._4_4_);
  if (iVar1 == 0) {
    __assert_fail("qpdf_oh_is_string(qpdf, p_string_with_null)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x331,"void test27(const char *, const char *, const char *, const char *)");
  }
  pcVar3 = (char *)qpdf_oh_get_string_value(qpdf,length._4_4_);
  iVar1 = strcmp(pcVar3,"one");
  if (iVar1 != 0) {
    __assert_fail("strcmp(qpdf_oh_get_string_value(qpdf, p_string_with_null), \"one\") == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x332,"void test27(const char *, const char *, const char *, const char *)");
  }
  lVar4 = qpdf_get_last_string_length(qpdf);
  if (lVar4 != 7) {
    __assert_fail("qpdf_get_last_string_length(qpdf) == 7",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x333,"void test27(const char *, const char *, const char *, const char *)");
  }
  plVar5 = (long *)qpdf_oh_get_string_value(qpdf,length._4_4_);
  if (*plVar5 != 0x6f777400656e6f) {
    __assert_fail("memcmp(qpdf_oh_get_string_value(qpdf, p_string_with_null), \"one\\000two\", 8) == 0"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x335,"void test27(const char *, const char *, const char *, const char *)");
  }
  lStack_38 = 0;
  length._4_4_ = qpdf_oh_new_binary_string(qpdf,"potato",0xc);
  pvVar6 = (void *)qpdf_oh_get_binary_string_value(qpdf,length._4_4_,&stack0xffffffffffffffc8);
  iVar1 = memcmp(pvVar6,"potato",0xd);
  if (iVar1 != 0) {
    __assert_fail("memcmp( qpdf_oh_get_binary_string_value(qpdf, p_string_with_null, &length), \"potato\\000salad\", 13) == 0"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x33d,"void test27(const char *, const char *, const char *, const char *)");
  }
  lVar4 = qpdf_get_last_string_length(qpdf);
  if (lVar4 != 0xc) {
    __assert_fail("qpdf_get_last_string_length(qpdf) == 12",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x33e,"void test27(const char *, const char *, const char *, const char *)");
  }
  if (lStack_38 != 0xc) {
    __assert_fail("length == 12",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x33f,"void test27(const char *, const char *, const char *, const char *)");
  }
  uVar2 = qpdf_oh_parse(qpdf,"<feff007100770000007700f703c0>");
  iVar1 = qpdf_oh_is_string(qpdf,uVar2);
  if (iVar1 != 0) {
    pcVar3 = (char *)qpdf_oh_get_utf8_value(qpdf,uVar2);
    iVar1 = strcmp(pcVar3,"qw");
    if (iVar1 != 0) {
      __assert_fail("strcmp(qpdf_oh_get_utf8_value(qpdf, p_utf8_string_with_null), \"qw\\x00w\\xc3\\xb7\\xcf\\x80\") == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                    ,0x345,"void test27(const char *, const char *, const char *, const char *)");
    }
    lVar4 = qpdf_get_last_string_length(qpdf);
    if (lVar4 != 8) {
      __assert_fail("qpdf_get_last_string_length(qpdf) == 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                    ,0x346,"void test27(const char *, const char *, const char *, const char *)");
    }
    plVar5 = (long *)qpdf_oh_get_utf8_value(qpdf,uVar2);
    if (*plVar5 != -0x7f30483c88ff888f) {
      __assert_fail("memcmp( qpdf_oh_get_utf8_value(qpdf, p_utf8_string_with_null), \"qw\\x00w\\xc3\\xb7\\xcf\\x80\", 8) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                    ,0x34b,"void test27(const char *, const char *, const char *, const char *)");
    }
    uVar2 = qpdf_oh_new_binary_unicode_string(qpdf,"qw",8);
    pvVar6 = (void *)qpdf_oh_get_binary_utf8_value(qpdf,uVar2,&stack0xffffffffffffffc8);
    iVar1 = memcmp(pvVar6,"qw",9);
    if (iVar1 == 0) {
      lVar4 = qpdf_get_last_string_length(qpdf);
      if (lVar4 != 8) {
        __assert_fail("qpdf_get_last_string_length(qpdf) == 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                      ,0x353,"void test27(const char *, const char *, const char *, const char *)");
      }
      if (lStack_38 == 8) {
        return;
      }
      __assert_fail("length == 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                    ,0x354,"void test27(const char *, const char *, const char *, const char *)");
    }
    __assert_fail("memcmp( qpdf_oh_get_binary_utf8_value(qpdf, p_utf8_string_with_null, &length), \"qw\\x00w\\xc3\\xb7\\xcf\\x80\", 9) == 0"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x352,"void test27(const char *, const char *, const char *, const char *)");
  }
  __assert_fail("qpdf_oh_is_string(qpdf, p_utf8_string_with_null)",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                0x342,"void test27(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test27(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    /* Exercise a string with a null. Since the regular methods return
     * char*, we can't see past the null character without looking
     * explicitly at the length.
     */
    qpdf_oh p_string_with_null = qpdf_oh_parse(qpdf, "<6f6e650074776f>");
    assert(qpdf_oh_is_string(qpdf, p_string_with_null));
    assert(strcmp(qpdf_oh_get_string_value(qpdf, p_string_with_null), "one") == 0);
    assert(qpdf_get_last_string_length(qpdf) == 7);
    /* memcmp adds a character to verify the trailing null */
    assert(memcmp(qpdf_oh_get_string_value(qpdf, p_string_with_null), "one\000two", 8) == 0);
    size_t length = 0;
    p_string_with_null = qpdf_oh_new_binary_string(qpdf, "potato\000salad", 12);
    /* memcmp adds a character to verify the trailing null */
    assert(
        memcmp(
            qpdf_oh_get_binary_string_value(qpdf, p_string_with_null, &length),
            "potato\000salad",
            13) == 0);
    assert(qpdf_get_last_string_length(qpdf) == 12);
    assert(length == 12);
    /* repeat for UTF8 string */
    qpdf_oh p_utf8_string_with_null = qpdf_oh_parse(qpdf, "<feff007100770000007700f703c0>");
    assert(qpdf_oh_is_string(qpdf, p_utf8_string_with_null));
    assert(
        strcmp(qpdf_oh_get_utf8_value(qpdf, p_utf8_string_with_null), "qw\x00w\xc3\xb7\xcf\x80") ==
        0);
    assert(qpdf_get_last_string_length(qpdf) == 8);
    /* memcmp adds a character to verify the trailing null */
    assert(
        memcmp(
            qpdf_oh_get_utf8_value(qpdf, p_utf8_string_with_null), "qw\x00w\xc3\xb7\xcf\x80", 8) ==
        0);
    p_utf8_string_with_null = qpdf_oh_new_binary_unicode_string(qpdf, "qw\x00w\xc3\xb7\xcf\x80", 8);
    /* memcmp adds a character to verify the trailing null */
    assert(
        memcmp(
            qpdf_oh_get_binary_utf8_value(qpdf, p_utf8_string_with_null, &length),
            "qw\x00w\xc3\xb7\xcf\x80",
            9) == 0);
    assert(qpdf_get_last_string_length(qpdf) == 8);
    assert(length == 8);
}